

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<Resource,_8UL>::~SmallVector(SmallVector<Resource,_8UL> *this)

{
  Resource *pRVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  
  if ((this->super_VectorView<Resource>).buffer_size != 0) {
    lVar3 = 0x20;
    uVar4 = 0;
    do {
      pRVar1 = (this->super_VectorView<Resource>).ptr;
      pvVar2 = *(void **)((long)pRVar1 + lVar3 + -0x10);
      if ((void *)((long)&pRVar1->var + lVar3) != pvVar2) {
        operator_delete(pvVar2);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x40;
    } while (uVar4 < (this->super_VectorView<Resource>).buffer_size);
  }
  (this->super_VectorView<Resource>).buffer_size = 0;
  pRVar1 = (this->super_VectorView<Resource>).ptr;
  if (pRVar1 != (Resource *)&this->stack_storage) {
    free(pRVar1);
    return;
  }
  return;
}

Assistant:

~SmallVector()
	{
		clear();
		if (this->ptr != stack_storage.data())
			free(this->ptr);
	}